

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::computePrimal(HModel *this)

{
  HVector *this_00;
  double dVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  int iVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  
  this_00 = &this->buffer;
  HVector::clear(this_00);
  iVar10 = this->numTot;
  if (0 < iVar10) {
    lVar11 = 0;
    do {
      if ((this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar11] != 0) {
        dVar12 = (this->workValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar11];
        if ((dVar12 != 0.0) || (NAN(dVar12))) {
          HMatrix::collect_aj(&this->matrix,this_00,(int)lVar11,dVar12);
          iVar10 = this->numTot;
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < iVar10);
  }
  HFactor::ftran(&this->factor,this_00,1.0);
  iVar10 = this->numRow;
  dVar12 = 0.0;
  if (0 < (long)iVar10) {
    piVar3 = (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->baseValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->buffer).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->baseLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (this->baseUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = 0;
    do {
      iVar2 = piVar3[lVar11];
      dVar1 = pdVar6[lVar11];
      dVar13 = pdVar5[lVar11] + dVar1;
      dVar12 = dVar12 + dVar13 * dVar13;
      pdVar5[lVar11] = -dVar1;
      pdVar7[lVar11] = pdVar4[iVar2];
      pdVar9[lVar11] = pdVar8[iVar2];
      lVar11 = lVar11 + 1;
    } while (iVar10 != lVar11);
  }
  if (dVar12 < 0.0) {
    sqrt(dVar12);
  }
  this->mlFg_haveBasicPrimals = 1;
  return;
}

Assistant:

void HModel::computePrimal() {
    buffer.clear();
    for (int i = 0; i < numTot; i++)
        if (nonbasicFlag[i] && workValue[i] != 0)
            matrix.collect_aj(buffer, i, workValue[i]);
    factor.ftran(buffer, 1);

#ifdef JAJH_dev
    int n_rp = 0;
    double rp_tl = 0.0;
    int mx_n_rp = 10;
    double norm_dl_pr = 0.0;
#endif

    for (int i = 0; i < numRow; i++) {
        int iCol = basicIndex[i];
#ifdef JAJH_dev
	double dl_pr = abs(baseValue[i] +buffer.array[i]);
	if (dl_pr > rp_tl && n_rp < mx_n_rp) {
	  rp_tl = dl_pr*10;
	  n_rp += 1;
	  //	  printf("computePrimal():   DlPr_i = %11g for i = %d\n", dl_pr, i);
	}
	norm_dl_pr += dl_pr*dl_pr;
#endif
        baseValue[i] = -buffer.array[i];
        baseLower[i] = workLower[iCol];
        baseUpper[i] = workUpper[iCol];
    }
#ifdef JAJH_dev
    norm_dl_pr = sqrt(norm_dl_pr);
    //    printf("computePrimal(): ||DlPr|| = %11g\n", norm_dl_pr);
#endif
    //Now have a basic primals
    mlFg_haveBasicPrimals = 1;
}